

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool SparseKeyTest<1024,Blob<224>>
               (hashfunc<Blob<224>_> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  pfHash p_Var2;
  size_type sVar3;
  byte in_CL;
  byte in_DL;
  char *pcVar4;
  uint in_ESI;
  byte in_R8B;
  byte in_R9B;
  bool result;
  Blob<224> h;
  bool in_stack_0000003b;
  bool in_stack_0000003c;
  bool in_stack_0000003d;
  bool in_stack_0000003e;
  bool in_stack_0000003f;
  keytype k;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> hashes;
  undefined4 in_stack_ffffffffffffff2c;
  byte bVar5;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> *in_stack_ffffffffffffff30;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> *in_stack_ffffffffffffff40;
  Blob<1024> *in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff57;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  pfHash in_stack_ffffffffffffff60;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> local_28;
  byte local_10;
  byte local_f;
  byte local_e;
  byte local_d;
  hashfunc local_8 [8];
  
  local_d = in_DL & 1;
  local_e = in_CL & 1;
  local_f = in_R8B & 1;
  local_10 = in_R9B & 1;
  pcVar4 = "exactly";
  if ((in_DL & 1) != 0) {
    pcVar4 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x400,pcVar4,(ulong)in_ESI);
  std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::vector
            ((vector<Blob<224>,_std::allocator<Blob<224>_>_> *)0x183dff);
  Blob<1024>::Blob((Blob<1024> *)&stack0xffffffffffffff58);
  memset(&stack0xffffffffffffff58,0,0x80);
  if ((local_d & 1) != 0) {
    Blob<224>::Blob((Blob<224> *)&stack0xffffffffffffff30);
    p_Var2 = hashfunc::operator_cast_to_function_pointer(local_8);
    (*p_Var2)(&stack0xffffffffffffff58,0x80,0,&stack0xffffffffffffff30);
    std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::push_back
              (in_stack_ffffffffffffff30,(value_type *)CONCAT44(in_stack_ffffffffffffff2c,in_ESI));
  }
  hashfunc::operator_cast_to_function_pointer(local_8);
  SparseKeygenRecurse<Blob<1024>,Blob<224>>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,
             (bool)in_stack_ffffffffffffff57,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  sVar3 = std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::size(&local_28);
  printf("%d keys\n",sVar3 & 0xffffffff);
  bVar5 = 1;
  bVar1 = TestHashList<Blob<224>>
                    ((vector<Blob<224>,_std::allocator<Blob<224>_>_> *)k.bytes._0_8_,
                     in_stack_0000003f,in_stack_0000003e,in_stack_0000003d,in_stack_0000003c,
                     in_stack_0000003b);
  bVar5 = bVar1 & bVar5;
  printf("\n");
  std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::~vector(in_stack_ffffffffffffff30);
  return (bool)(bVar5 & 1);
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive, bool testColl, bool testDist, bool drawDiagram  )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits, inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashtype h;

    hash(&k,sizeof(keytype),0,&h);

    hashes.push_back(h);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}